

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_id_getter.cpp
# Opt level: O0

void __thiscall SharedIdGetter::SharedIdGetter(SharedIdGetter *this,uid_t start,uid_t count)

{
  type this_00;
  uint *puVar1;
  ulong uVar2;
  pointer this_01;
  unsigned_long *puVar3;
  int iVar4;
  ulong local_40;
  size_t i;
  unique_ptr<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
  local_30 [3];
  uid_t local_18;
  uid_t local_14;
  uid_t count_local;
  uid_t start_local;
  SharedIdGetter *this_local;
  
  local_18 = count;
  local_14 = start;
  _count_local = this;
  std::
  unique_ptr<SharedMemoryArray<unsigned_int>,std::default_delete<SharedMemoryArray<unsigned_int>>>::
  unique_ptr<std::default_delete<SharedMemoryArray<unsigned_int>>,void>
            ((unique_ptr<SharedMemoryArray<unsigned_int>,std::default_delete<SharedMemoryArray<unsigned_int>>>
              *)this);
  std::
  unique_ptr<SharedMemoryObject<unsigned_long>,std::default_delete<SharedMemoryObject<unsigned_long>>>
  ::unique_ptr<std::default_delete<SharedMemoryObject<unsigned_long>>,void>
            ((unique_ptr<SharedMemoryObject<unsigned_long>,std::default_delete<SharedMemoryObject<unsigned_long>>>
              *)&this->stack_head_);
  SharedMutex::SharedMutex(&this->mutex_);
  std::make_unique<SharedMemoryArray<unsigned_int>,unsigned_int&>((uint *)local_30);
  std::
  unique_ptr<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
  ::operator=(&this->ids_stack_,local_30);
  std::
  unique_ptr<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
  ::~unique_ptr(local_30);
  std::make_unique<SharedMemoryObject<unsigned_long>>();
  std::
  unique_ptr<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
  ::operator=(&this->stack_head_,
              (unique_ptr<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
               *)&i);
  std::
  unique_ptr<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
  ::~unique_ptr((unique_ptr<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
                 *)&i);
  for (local_40 = 0; local_40 < local_18; local_40 = local_40 + 1) {
    iVar4 = local_14 + local_18;
    this_00 = std::
              unique_ptr<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
              ::operator*(&this->ids_stack_);
    puVar1 = SharedMemoryArray<unsigned_int>::operator[](this_00,local_40);
    *puVar1 = ~(uint)local_40 + iVar4;
  }
  uVar2 = (ulong)local_18;
  this_01 = std::
            unique_ptr<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
            ::operator->(&this->stack_head_);
  puVar3 = SharedMemoryObject<unsigned_long>::get(this_01);
  *puVar3 = uVar2;
  return;
}

Assistant:

SharedIdGetter::SharedIdGetter(uid_t start, uid_t count) {
    ids_stack_ = std::make_unique<SharedMemoryArray<uid_t>>(count);
    stack_head_ = std::make_unique<SharedMemoryObject<size_t>>();
    for (size_t i = 0; i < count; ++i) {
        (*ids_stack_)[i] = start + count - 1 - i; // Lower the ID is, closer to stack head it is
    }
    (*stack_head_->get()) = count;
}